

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong *puVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong *puVar25;
  uint uVar26;
  ulong uVar27;
  ulong local_a0;
  ulong local_98;
  
  sVar11 = 0xffffffffffffffba;
  if (8 < dstCapacity) {
    uVar2 = (ushort)*CTable_MatchLength;
    uVar17 = (ulong)mlCodeTable[nbSeq - 1];
    lVar13 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
    if (uVar2 == 0) {
      lVar13 = 1;
    }
    uVar24 = CTable_MatchLength[lVar13 + uVar17 * 2 + 2] + 0x8000;
    uVar3 = (ushort)*CTable_OffsetBits;
    bVar1 = ofCodeTable[nbSeq - 1];
    uVar8 = (ulong)bVar1;
    lVar14 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
    if (uVar3 == 0) {
      lVar14 = 1;
    }
    uVar21 = CTable_OffsetBits[lVar14 + uVar8 * 2 + 2] + 0x8000;
    uVar4 = *(ushort *)
             ((long)CTable_MatchLength +
             (long)(int)CTable_MatchLength[lVar13 + uVar17 * 2 + 1] * 2 +
             (ulong)((uVar24 & 0xffff0000) - CTable_MatchLength[lVar13 + uVar17 * 2 + 2] >>
                    ((byte)(uVar24 >> 0x10) & 0x3f)) * 2 + 4);
    local_98 = (ulong)*(ushort *)
                       ((long)CTable_OffsetBits +
                       (long)(int)CTable_OffsetBits[lVar14 + uVar8 * 2 + 1] * 2 +
                       (ulong)((uVar21 & 0xffff0000) - CTable_OffsetBits[lVar14 + uVar8 * 2 + 2] >>
                              ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
    uVar5 = (ushort)*CTable_LitLength;
    lVar15 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
    if (uVar5 == 0) {
      lVar15 = 1;
    }
    uVar7 = (ulong)llCodeTable[nbSeq - 1];
    uVar24 = CTable_LitLength[lVar15 + uVar7 * 2 + 2] + 0x8000;
    local_a0 = (ulong)*(ushort *)
                       ((long)CTable_LitLength +
                       (long)(int)CTable_LitLength[lVar15 + uVar7 * 2 + 1] * 2 +
                       (ulong)((uVar24 & 0xffff0000) - CTable_LitLength[lVar15 + uVar7 * 2 + 2] >>
                              ((byte)(uVar24 >> 0x10) & 0x3f)) * 2 + 4);
    uVar24 = LL_bits[uVar7];
    uVar7 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar17]]) <<
            ((byte)uVar24 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar24])
    ;
    uVar24 = ML_bits[uVar17] + uVar24;
    puVar16 = (ulong *)((long)dst + (dstCapacity - 8));
    puVar10 = (ulong *)dst;
    if (longOffsets == 0) {
      uVar7 = (ulong)(BIT_mask[uVar8] & sequences[nbSeq - 1].offset) << ((byte)uVar24 & 0x3f) |
              uVar7;
      uVar24 = uVar24 + bVar1;
    }
    else {
      uVar21 = 0x38;
      if (bVar1 < 0x38) {
        uVar21 = (uint)bVar1;
      }
      uVar20 = bVar1 - uVar21;
      if (0x38 < bVar1) {
        uVar7 = (ulong)(BIT_mask[uVar20] & sequences[nbSeq - 1].offset) << ((byte)uVar24 & 0x3f) |
                uVar7;
        uVar24 = uVar24 + uVar20;
        puVar10 = (ulong *)((ulong)(uVar24 >> 3) + (long)dst);
        if (puVar16 < puVar10) {
          puVar10 = puVar16;
        }
        *(ulong *)dst = uVar7;
        uVar7 = uVar7 >> ((byte)uVar24 & 0x38);
        uVar24 = uVar24 & 7;
      }
      uVar7 = (ulong)(sequences[nbSeq - 1].offset >> ((byte)uVar20 & 0x1f) & BIT_mask[uVar21]) <<
              ((byte)uVar24 & 0x3f) | uVar7;
      uVar24 = uVar24 + uVar21;
    }
    puVar25 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar10);
    if (puVar16 < puVar25) {
      puVar25 = puVar16;
    }
    *puVar10 = uVar7;
    uVar7 = uVar7 >> ((byte)uVar24 & 0x38);
    uVar24 = uVar24 & 7;
    if (1 < nbSeq) {
      uVar17 = nbSeq - 2;
      do {
        uVar27 = (ulong)llCodeTable[uVar17];
        bVar1 = ofCodeTable[uVar17];
        uVar23 = (ulong)bVar1;
        uVar19 = (ulong)mlCodeTable[uVar17];
        uVar8 = CTable_OffsetBits[lVar14 + uVar23 * 2 + 2] + local_98;
        uVar20 = (uint)local_98;
        iVar6 = (int)(uVar8 >> 0x10) + uVar24;
        local_98 = (ulong)*(ushort *)
                           ((long)CTable_OffsetBits +
                           (long)(int)CTable_OffsetBits[lVar14 + uVar23 * 2 + 1] * 2 +
                           (local_98 >> ((byte)(uVar8 >> 0x10) & 0x3f)) * 2 + 4);
        uVar22 = (ulong)CTable_MatchLength[lVar13 + uVar19 * 2 + 2] + (ulong)uVar4;
        uVar21 = (uint)uVar4;
        iVar12 = (int)(uVar22 >> 0x10) + iVar6;
        uVar9 = CTable_LitLength[lVar15 + uVar27 * 2 + 2] + local_a0;
        uVar4 = *(ushort *)
                 ((long)CTable_MatchLength +
                 (long)(int)CTable_MatchLength[lVar13 + uVar19 * 2 + 1] * 2 +
                 (ulong)(uVar4 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
        uVar7 = (ulong)(BIT_mask[uVar9 >> 0x10] & (uint)local_a0) << ((byte)iVar12 & 0x3f) |
                (ulong)(BIT_mask[uVar22 >> 0x10] & uVar21) << ((byte)iVar6 & 0x3f) |
                (ulong)(BIT_mask[uVar8 >> 0x10] & uVar20) << (sbyte)uVar24 | uVar7;
        uVar21 = LL_bits[uVar27];
        uVar24 = ML_bits[uVar19];
        uVar20 = (int)(uVar9 >> 0x10) + iVar12;
        local_a0 = (ulong)*(ushort *)
                           ((long)CTable_LitLength +
                           (long)(int)CTable_LitLength[lVar15 + uVar27 * 2 + 1] * 2 +
                           (local_a0 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
        uVar26 = uVar24 + uVar21 + bVar1;
        if (0x1e < uVar26) {
          puVar10 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar25);
          if (puVar16 < puVar10) {
            puVar10 = puVar16;
          }
          *puVar25 = uVar7;
          uVar7 = uVar7 >> ((byte)uVar20 & 0x38);
          uVar20 = uVar20 & 7;
          puVar25 = puVar10;
        }
        uVar7 = (ulong)((uint)sequences[uVar17].matchLength & BIT_mask[uVar24]) <<
                ((byte)(uVar21 + uVar20) & 0x3f) |
                (ulong)((uint)sequences[uVar17].litLength & BIT_mask[uVar21]) <<
                ((byte)uVar20 & 0x3f) | uVar7;
        uVar24 = uVar24 + uVar21 + uVar20;
        puVar10 = puVar25;
        if (0x38 < uVar26) {
          puVar10 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar25);
          if (puVar16 < puVar10) {
            puVar10 = puVar16;
          }
          *puVar25 = uVar7;
          uVar7 = uVar7 >> ((byte)uVar24 & 0x38);
          uVar24 = uVar24 & 7;
        }
        if (longOffsets == 0) {
          uVar7 = (ulong)(BIT_mask[uVar23] & sequences[uVar17].offset) << ((byte)uVar24 & 0x3f) |
                  uVar7;
          uVar24 = uVar24 + bVar1;
        }
        else {
          uVar21 = (uint)bVar1;
          if (0x37 < bVar1) {
            uVar21 = 0x38;
          }
          uVar20 = bVar1 - uVar21;
          puVar25 = puVar10;
          if (0x38 < bVar1) {
            uVar7 = (ulong)(BIT_mask[uVar20] & sequences[uVar17].offset) << ((byte)uVar24 & 0x3f) |
                    uVar7;
            uVar24 = uVar24 + uVar20;
            puVar25 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar10);
            if (puVar16 < puVar25) {
              puVar25 = puVar16;
            }
            *puVar10 = uVar7;
            uVar7 = uVar7 >> ((byte)uVar24 & 0x38);
            uVar24 = uVar24 & 7;
          }
          uVar7 = (ulong)(sequences[uVar17].offset >> ((byte)uVar20 & 0x1f) & BIT_mask[uVar21]) <<
                  ((byte)uVar24 & 0x3f) | uVar7;
          uVar24 = uVar24 + uVar21;
          puVar10 = puVar25;
        }
        puVar25 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar10);
        if (puVar16 < puVar25) {
          puVar25 = puVar16;
        }
        *puVar10 = uVar7;
        uVar7 = uVar7 >> ((byte)uVar24 & 0x38);
        uVar17 = uVar17 - 1;
        uVar24 = uVar24 & 7;
      } while (uVar17 < nbSeq);
    }
    uVar7 = (ulong)((uint)uVar4 & BIT_mask[uVar2]) << (sbyte)uVar24 | uVar7;
    uVar24 = uVar24 + uVar2;
    puVar10 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar25);
    if (puVar16 < puVar10) {
      puVar10 = puVar16;
    }
    *puVar25 = uVar7;
    uVar17 = (ulong)((uint)local_98 & BIT_mask[uVar3]) << (sbyte)(uVar24 & 7) |
             uVar7 >> ((byte)uVar24 & 0x38);
    uVar24 = (uVar24 & 7) + (uint)uVar3;
    puVar25 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar10);
    if (puVar16 < puVar25) {
      puVar25 = puVar16;
    }
    *puVar10 = uVar17;
    uVar17 = (ulong)((uint)local_a0 & BIT_mask[uVar5]) << (sbyte)(uVar24 & 7) |
             uVar17 >> ((byte)uVar24 & 0x38);
    uVar24 = (uVar24 & 7) + (uint)uVar5;
    *puVar25 = uVar17;
    puVar25 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar25);
    if (puVar16 < puVar25) {
      puVar25 = puVar16;
    }
    uVar21 = (uVar24 & 7) + 1;
    puVar10 = (ulong *)((ulong)(uVar21 >> 3) + (long)puVar25);
    if (puVar16 < puVar10) {
      puVar10 = puVar16;
    }
    *puVar25 = uVar17 >> ((byte)uVar24 & 0x38) | 1L << (uVar24 & 7);
    sVar18 = 0;
    if (puVar10 < puVar16) {
      sVar18 = (long)puVar10 - ((long)dst + ((ulong)((uVar21 & 7) == 0) - 1));
    }
    sVar11 = 0xffffffffffffffba;
    if (sVar18 != 0) {
      sVar11 = sVar18;
    }
  }
  return sVar11;
}

Assistant:

static size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}